

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack2_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 3;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 2 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 4 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 6 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *in >> 8 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *in >> 10 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *in >> 0xc & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *in >> 0xe & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *in >> 0x10 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *in >> 0x12 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *in >> 0x14 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *in >> 0x16 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *in >> 0x18 & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *in >> 0x1a & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *in >> 0x1c & 3;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = *in >> 0x1e;
  *puVar1 = base + *puVar1;
  return in + 1;
}

Assistant:

uint32_t * unpack2_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  2  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  6  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  10  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  14  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  20  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  )   % (1U << 2 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}